

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void add_range_closed_at(roaring64_bitmap_t *r,art_t *art,uint8_t *high48,uint16_t min,uint16_t max)

{
  container_t *c;
  ulong uVar1;
  art_val_t *paVar2;
  container_t *pcVar3;
  array_container_t *container;
  uint *puVar4;
  leaf_t val;
  uint8_t uVar5;
  int iVar6;
  uint8_t typecode2;
  uint8_t local_39;
  roaring64_bitmap_t *local_38;
  
  paVar2 = art_find(art,high48);
  if (paVar2 != (art_val_t *)0x0) {
    c = r->containers[*paVar2 >> 8];
    uVar5 = (uint8_t)*paVar2;
    local_38 = r;
    pcVar3 = container_add_range(c,uVar5,(uint)min,(uint)max,&local_39);
    if (pcVar3 != c) {
      container_free(c,uVar5);
      uVar1 = *paVar2;
      local_38->containers[uVar1 >> 8] = pcVar3;
      *paVar2 = CONCAT71((int7)(uVar1 >> 8),local_39);
    }
    return;
  }
  iVar6 = (uint)max - (uint)min;
  if (iVar6 + 2U < 3) {
    container = array_container_create_range((uint)min,max + 1);
    uVar5 = '\x02';
  }
  else {
    container = (array_container_t *)(*global_memory_hook.malloc)(0x10);
    uVar5 = '\x03';
    if (container == (array_container_t *)0x0) {
      container = (array_container_t *)0x0;
    }
    else {
      puVar4 = (uint *)(*global_memory_hook.malloc)(4);
      container->array = (uint16_t *)puVar4;
      if (puVar4 == (uint *)0x0) {
        (*global_memory_hook.free)(container);
        container = (array_container_t *)0x0;
      }
      else {
        container->cardinality = 0;
        container->capacity = 1;
        *puVar4 = iVar6 * 0x10000 | (uint)min;
        container->cardinality = container->cardinality + 1;
      }
      uVar5 = '\x03';
    }
  }
  val = add_container(r,container,uVar5);
  art_insert(art,high48,val);
  return;
}

Assistant:

static inline void add_range_closed_at(roaring64_bitmap_t *r, art_t *art,
                                       uint8_t *high48, uint16_t min,
                                       uint16_t max) {
    leaf_t *leaf = (leaf_t *)art_find(art, high48);
    if (leaf != NULL) {
        uint8_t typecode1 = get_typecode(*leaf);
        container_t *container1 = get_container(r, *leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_add_range(container1, typecode1, min, max, &typecode2);
        if (container2 != container1) {
            container_free(container1, typecode1);
            replace_container(r, leaf, container2, typecode2);
        }
        return;
    }
    uint8_t typecode;
    // container_add_range is inclusive, but `container_range_of_ones` is
    // exclusive.
    container_t *container = container_range_of_ones(min, max + 1, &typecode);
    leaf_t new_leaf = add_container(r, container, typecode);
    art_insert(art, high48, (art_val_t)new_leaf);
}